

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Sphere::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Sphere *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  Float FVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  Transform *this_00;
  undefined1 auVar6 [16];
  float fVar7;
  undefined8 uVar8;
  Point3fi pi;
  Normal3f dndu;
  Normal3f dndv;
  Vector3f dpdv;
  Vector3f dpdu;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar21;
  float fVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar23 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  float fVar24;
  undefined1 auVar25 [64];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Vector3<float> VVar36;
  Point3f pHit;
  Point2f local_198;
  Point3f local_180;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Vector3<float> local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  undefined1 auVar26 [60];
  
  fVar5 = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  local_180.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  local_180.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  auVar33 = *(undefined1 (*) [16])&this->phiMax;
  FVar1 = isect->phi;
  fVar12 = fVar5 / this->radius;
  local_180.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
  fVar13 = SafeACos(fVar12);
  fVar7 = this->thetaZMax - this->thetaZMin;
  auVar11 = vinsertps_avx(ZEXT416((uint)FVar1),ZEXT416((uint)(fVar13 - this->thetaZMin)),0x10);
  auVar17._4_4_ = fVar7;
  auVar17._0_4_ = fVar7;
  auVar17._8_4_ = fVar7;
  auVar17._12_4_ = fVar7;
  auVar33 = vblendps_avx(auVar17,auVar33,0xd);
  auVar31._0_12_ = ZEXT812(0);
  auVar31._12_4_ = 0;
  auVar17 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar12 * fVar12)),auVar31);
  auVar6 = vsqrtss_avx(auVar17,auVar17);
  auVar17 = vdivps_avx(auVar11,auVar33);
  fVar12 = this->phiMax;
  local_150.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar32._8_8_ = 0;
  auVar32._0_4_ = local_180.super_Tuple3<pbrt::Point3,_float>.x;
  auVar32._4_4_ = local_180.super_Tuple3<pbrt::Point3,_float>.y;
  local_160.z = fVar7 * auVar6._0_4_ * -this->radius;
  auVar33 = vmovshdup_avx(auVar32);
  fVar16 = local_180.super_Tuple3<pbrt::Point3,_float>.x;
  local_150.super_Tuple3<pbrt::Vector3,_float>.y = fVar16 * fVar12;
  fVar21 = auVar33._0_4_;
  local_150.super_Tuple3<pbrt::Vector3,_float>.x = fVar21 * -fVar12;
  fVar13 = fVar12 * -fVar12;
  auVar33 = ZEXT416((uint)(fVar21 * fVar21 + fVar16 * fVar16));
  auVar33 = vsqrtss_avx(auVar33,auVar33);
  fVar12 = fVar12 * fVar5 * fVar7;
  auVar34._0_4_ = auVar33._0_4_;
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  auVar33 = vdivps_avx(auVar32,auVar34);
  auVar11 = vmovshdup_avx(auVar33);
  auVar35._0_4_ = fVar5 * auVar33._0_4_ * fVar7;
  auVar35._4_4_ = fVar5 * auVar33._4_4_ * fVar7;
  auVar35._8_4_ = fVar5 * auVar33._8_4_ * fVar7;
  auVar35._12_4_ = fVar5 * auVar33._12_4_ * fVar7;
  fVar7 = fVar7 * -fVar7;
  local_160._0_8_ = vmovlps_avx(auVar35);
  auVar18 = ZEXT416((uint)local_150.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_150.super_Tuple3<pbrt::Vector3,_float>.y *
                                         local_150.super_Tuple3<pbrt::Vector3,_float>.y)),auVar18,
                           auVar18);
  fVar14 = auVar6._0_4_;
  auVar6 = vmovshdup_avx(auVar35);
  fVar15 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_150.super_Tuple3<pbrt::Vector3,_float>.y * fVar15)),
                           auVar35,auVar18);
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar35,auVar35);
  auVar30 = ZEXT416((uint)local_160.z);
  auVar6 = vfmadd231ss_fma(auVar6,auVar30,ZEXT816(0) << 0x40);
  auVar26 = ZEXT1260(auVar6._4_12_);
  auVar18 = vfmadd231ss_fma(auVar18,auVar30,auVar30);
  auVar23 = ZEXT856(auVar18._8_8_);
  fVar24 = auVar6._0_4_;
  fVar15 = auVar18._0_4_;
  VVar36 = Cross<float>(&local_150,(Vector3<float> *)&local_160);
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar23;
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar19._0_16_);
  VVar36 = Normalize<float>((Vector3<float> *)&local_128);
  fVar10 = local_150.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar9 = local_150.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar25._0_4_ = VVar36.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._4_60_ = auVar26;
  auVar20._0_8_ = VVar36.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar23;
  auVar18 = auVar20._0_16_;
  auVar6 = vmovshdup_avx(auVar18);
  fVar27 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar21 * fVar13)),auVar18,
                           ZEXT416((uint)(fVar16 * fVar13)));
  auVar11 = vfnmadd231ss_fma(ZEXT416((uint)(fVar27 * auVar33._0_4_ * fVar12)),auVar18,
                             ZEXT416((uint)(fVar12 * auVar11._0_4_)));
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar21 * fVar7)),auVar18,
                            ZEXT416((uint)(fVar16 * fVar7)));
  auVar18 = auVar25._0_16_;
  auVar11 = vfmadd231ss_fma(auVar11,auVar18,ZEXT416((uint)(fVar12 * 0.0)));
  auVar6 = vfmadd231ss_fma(auVar6,auVar18,ZEXT416((uint)(fVar13 * 0.0)));
  auVar33 = vfmadd231ss_fma(auVar33,auVar18,ZEXT416((uint)(fVar5 * fVar7)));
  auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar14),
                            ZEXT416((uint)(fVar24 * fVar24)));
  auVar31 = ZEXT416((uint)fVar24);
  auVar30 = vfnmadd231ss_fma(ZEXT416((uint)(fVar24 * fVar24)),auVar31,auVar31);
  fVar12 = auVar18._0_4_ + auVar30._0_4_;
  uVar8 = vcmpss_avx512f(ZEXT416((uint)fVar12),ZEXT816(0) << 0x40,0);
  auVar18 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * auVar11._0_4_)),auVar31,auVar6);
  fVar27 = (float)((uint)!(bool)((byte)uVar8 & 1) * (int)(1.0 / fVar12));
  fVar12 = fVar27 * auVar18._0_4_;
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar15 * auVar6._0_4_)),auVar11,auVar31);
  fVar5 = fVar27 * auVar6._0_4_;
  fVar13 = local_160.z * fVar12;
  fVar7 = local_150.super_Tuple3<pbrt::Vector3,_float>.z * fVar5;
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar15 * auVar11._0_4_)),auVar33,ZEXT416((uint)fVar24));
  auVar33 = vfmsub231ss_fma(ZEXT416((uint)(fVar14 * auVar33._0_4_)),ZEXT416((uint)fVar24),auVar11);
  auVar30._8_8_ = 0;
  auVar30._0_4_ = local_180.super_Tuple3<pbrt::Point3,_float>.x;
  auVar30._4_4_ = local_180.super_Tuple3<pbrt::Point3,_float>.y;
  fVar14 = fVar27 * auVar6._0_4_;
  fVar15 = local_150.super_Tuple3<pbrt::Vector3,_float>.z * fVar14;
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  fVar27 = local_160.z * fVar27 * auVar33._0_4_;
  auVar33 = vandps_avx(ZEXT416((uint)local_180.super_Tuple3<pbrt::Point3,_float>.z),auVar18);
  auVar11 = vandps_avx(auVar30,auVar18);
  auVar6._8_4_ = 0x34a00003;
  auVar6._0_8_ = 0x34a0000334a00003;
  auVar6._12_4_ = 0x34a00003;
  auVar11 = vmulps_avx512vl(auVar11,auVar6);
  local_170.z = auVar33._0_4_ * 2.980233e-07;
  local_170._0_8_ = vmovlps_avx(auVar11);
  bVar3 = this->reverseOrientation;
  bVar4 = this->transformSwapsHandedness;
  fVar16 = local_150.super_Tuple3<pbrt::Vector3,_float>.x * fVar5;
  fVar21 = local_150.super_Tuple3<pbrt::Vector3,_float>.y * fVar5;
  fVar28 = local_160.x;
  fVar29 = local_160.y;
  fVar22 = fVar5 * 0.0 + fVar12 * 0.0;
  fVar24 = fVar22;
  VVar36 = Transform::operator()(this->objectFromRender,wo);
  this_00 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&local_180,(Vector3f *)&local_170);
  auVar33._4_4_ = fVar21 + fVar29 * fVar12;
  auVar33._0_4_ = fVar16 + fVar28 * fVar12;
  auVar33._8_4_ = fVar22;
  auVar33._12_4_ = fVar5 * 0.0 + fVar12 * 0.0;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_150.super_Tuple3<pbrt::Vector3,_float>.y;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_150.super_Tuple3<pbrt::Vector3,_float>.x;
  dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_150.super_Tuple3<pbrt::Vector3,_float>.z;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.z = local_160.z;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.x = local_160.x;
  dpdv.super_Tuple3<pbrt::Vector3,_float>.y = local_160.y;
  uVar8 = vmovlps_avx(auVar33);
  auVar11._0_4_ = fVar14 * fVar9 + fVar24 * fVar28;
  auVar11._4_4_ = fVar14 * fVar10 + fVar24 * fVar29;
  auVar11._8_4_ = fVar14 * 0.0 + fVar24 * 0.0;
  auVar11._12_4_ = fVar14 * 0.0 + fVar24 * 0.0;
  uVar2 = vmovlps_avx(auVar11);
  local_198.super_Tuple2<pbrt::Point2,_float> = auVar17._0_8_;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       local_140.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
  dndu.super_Tuple3<pbrt::Normal3,_float>.z = fVar13 + fVar7;
  dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar8;
  dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar8 >> 0x20);
  dndv.super_Tuple3<pbrt::Normal3,_float>.z = fVar15 + fVar27;
  dndv.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
  dndv.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,pi,local_198,(Vector3f)VVar36.super_Tuple3<pbrt::Vector3,_float>,dpdu,dpdv,
             dndu,dndv,time,bVar3 != bVar4);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of sphere hit
        Float u = phi / phiMax;
        Float cosTheta = pHit.z / radius;
        Float theta = SafeACos(cosTheta);
        Float v = (theta - thetaZMin) / (thetaZMax - thetaZMin);
        // Compute sphere $\dpdu$ and $\dpdv$
        Float zRadius = std::sqrt(Sqr(pHit.x) + Sqr(pHit.y));
        Float cosPhi = pHit.x / zRadius;
        Float sinPhi = pHit.y / zRadius;
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Float sinTheta = SafeSqrt(1 - Sqr(cosTheta));
        Vector3f dpdv = (thetaZMax - thetaZMin) *
                        Vector3f(pHit.z * cosPhi, pHit.z * sinPhi, -radius * sinTheta);

        // Compute sphere $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv =
            (thetaZMax - thetaZMin) * pHit.z * phiMax * Vector3f(-sinPhi, cosPhi, 0.);
        Vector3f d2Pdvv = -Sqr(thetaZMax - thetaZMin) * Vector3f(pHit.x, pHit.y, pHit.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float EGF2 = DifferenceOfProducts(E, G, F, F);
        Float invEGF2 = (EGF2 == 0) ? Float(0) : 1 / EGF2;
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for sphere intersection
        Vector3f pError = gamma(5) * Abs((Vector3f)pHit);

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }